

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flicker_remover_cpu.cxx
# Opt level: O2

void __thiscall FlickerRemoverCPU::clear(FlickerRemoverCPU *this)

{
  BooleanArray2D *pBVar1;
  
  while( true ) {
    pBVar1 = CircularBuffer<BooleanArray2D_*>::pop(&this->corresponding_frames_similarity_levels);
    if (pBVar1 == (BooleanArray2D *)0x0) break;
    BooleanArray2D::~BooleanArray2D(pBVar1);
    operator_delete(pBVar1,0x10);
  }
  while( true ) {
    pBVar1 = CircularBuffer<BooleanArray2D_*>::pop(&this->adjacent_frames_similarity_levels);
    if (pBVar1 == (BooleanArray2D *)0x0) break;
    BooleanArray2D::~BooleanArray2D(pBVar1);
    operator_delete(pBVar1,0x10);
  }
  return;
}

Assistant:

void FlickerRemoverCPU::clear()
{
    auto to_delete_1 = corresponding_frames_similarity_levels.pop();
    while(to_delete_1 != nullptr) {
        delete to_delete_1;
        to_delete_1 = corresponding_frames_similarity_levels.pop();
    }
    auto to_delete_2 = adjacent_frames_similarity_levels.pop();
    while(to_delete_2 != nullptr) {
        delete to_delete_2;
        to_delete_2 = adjacent_frames_similarity_levels.pop();
    }
}